

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O0

void Assimp::Write(JSONWriter *out,aiMaterial *ai,bool is_elem)

{
  aiMaterial *paVar1;
  undefined1 local_530 [8];
  aiString s;
  uint i_2;
  uint i_1;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  aiMaterialProperty *local_60;
  aiMaterialProperty *prop;
  uint i;
  allocator<char> local_41;
  string local_40;
  undefined1 local_19;
  aiMaterial *paStack_18;
  bool is_elem_local;
  aiMaterial *ai_local;
  JSONWriter *out_local;
  
  local_19 = is_elem;
  paStack_18 = ai;
  ai_local = (aiMaterial *)out;
  JSONWriter::StartObj(out,is_elem);
  paVar1 = ai_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"properties",&local_41);
  JSONWriter::Key((JSONWriter *)paVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  JSONWriter::StartArray((JSONWriter *)ai_local,false);
  for (prop._0_4_ = 0; (uint)prop < paStack_18->mNumProperties; prop._0_4_ = (uint)prop + 1) {
    local_60 = paStack_18->mProperties[(uint)prop];
    JSONWriter::StartObj((JSONWriter *)ai_local,true);
    paVar1 = ai_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"key",&local_81);
    JSONWriter::Key((JSONWriter *)paVar1,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    JSONWriter::SimpleValue<aiString>((JSONWriter *)ai_local,&local_60->mKey);
    paVar1 = ai_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"semantic",&local_a9);
    JSONWriter::Key((JSONWriter *)paVar1,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
    JSONWriter::SimpleValue<unsigned_int>((JSONWriter *)ai_local,&local_60->mSemantic);
    paVar1 = ai_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"index",&local_d1);
    JSONWriter::Key((JSONWriter *)paVar1,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator(&local_d1);
    JSONWriter::SimpleValue<unsigned_int>((JSONWriter *)ai_local,&local_60->mIndex);
    paVar1 = ai_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"type",&local_f9);
    JSONWriter::Key((JSONWriter *)paVar1,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator(&local_f9);
    JSONWriter::SimpleValue<aiPropertyTypeInfo>((JSONWriter *)ai_local,&local_60->mType);
    paVar1 = ai_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&i_1,"value",(allocator<char> *)((long)&i_2 + 3));
    JSONWriter::Key((JSONWriter *)paVar1,(string *)&i_1);
    std::__cxx11::string::~string((string *)&i_1);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i_2 + 3));
    switch(local_60->mType) {
    case aiPTI_Float:
      if (local_60->mDataLength >> 2 < 2) {
        JSONWriter::SimpleValue<float>((JSONWriter *)ai_local,(float *)local_60->mData);
      }
      else {
        JSONWriter::StartArray((JSONWriter *)ai_local,false);
        s.data[0x3fc] = '\0';
        s.data[0x3fd] = '\0';
        s.data[0x3fe] = '\0';
        s.data[0x3ff] = '\0';
        for (; (uint)s.data._1020_4_ < local_60->mDataLength >> 2;
            s.data._1020_4_ = s.data._1020_4_ + 1) {
          JSONWriter::Element<float>
                    ((JSONWriter *)ai_local,
                     (float *)(local_60->mData + (ulong)(uint)s.data._1020_4_ * 4));
        }
        JSONWriter::EndArray((JSONWriter *)ai_local);
      }
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Assjson/json_exporter.cpp"
                    ,0x1f7,"void Assimp::Write(JSONWriter &, const aiMaterial &, bool)");
    case aiPTI_String:
      aiString::aiString((aiString *)local_530);
      aiGetMaterialString(paStack_18,(local_60->mKey).data,local_60->mSemantic,local_60->mIndex,
                          (aiString *)local_530);
      JSONWriter::SimpleValue<aiString>((JSONWriter *)ai_local,(aiString *)local_530);
      break;
    case aiPTI_Integer:
      if (local_60->mDataLength >> 2 < 2) {
        JSONWriter::SimpleValue<int>((JSONWriter *)ai_local,(int *)local_60->mData);
      }
      else {
        JSONWriter::StartArray((JSONWriter *)ai_local,false);
        s.data[0x3f8] = '\0';
        s.data[0x3f9] = '\0';
        s.data[0x3fa] = '\0';
        s.data[0x3fb] = '\0';
        for (; (uint)s.data._1016_4_ < local_60->mDataLength >> 2;
            s.data._1016_4_ = s.data._1016_4_ + 1) {
          JSONWriter::Element<int>
                    ((JSONWriter *)ai_local,
                     (int *)(local_60->mData + (ulong)(uint)s.data._1016_4_ * 4));
        }
        JSONWriter::EndArray((JSONWriter *)ai_local);
      }
      break;
    case aiPTI_Buffer:
      JSONWriter::SimpleValue((JSONWriter *)ai_local,local_60->mData,(ulong)local_60->mDataLength);
    }
    JSONWriter::EndObj((JSONWriter *)ai_local);
  }
  JSONWriter::EndArray((JSONWriter *)ai_local);
  JSONWriter::EndObj((JSONWriter *)ai_local);
  return;
}

Assistant:

void Write(JSONWriter& out, const aiMaterial& ai, bool is_elem = true) {
    out.StartObj(is_elem);

    out.Key("properties");
    out.StartArray();
    for (unsigned int i = 0; i < ai.mNumProperties; ++i) {
        const aiMaterialProperty* const prop = ai.mProperties[i];
        out.StartObj(true);
        out.Key("key");
        out.SimpleValue(prop->mKey);
        out.Key("semantic");
        out.SimpleValue(prop->mSemantic);
        out.Key("index");
        out.SimpleValue(prop->mIndex);

        out.Key("type");
        out.SimpleValue(prop->mType);

        out.Key("value");
        switch (prop->mType) {
            case aiPTI_Float:
                if (prop->mDataLength / sizeof(float) > 1) {
                    out.StartArray();
                    for (unsigned int i = 0; i < prop->mDataLength / sizeof(float); ++i) {
                        out.Element(reinterpret_cast<float*>(prop->mData)[i]);
                    }
                    out.EndArray();
                }
                else {
                    out.SimpleValue(*reinterpret_cast<float*>(prop->mData));
                }
                break;

            case aiPTI_Integer:
                if (prop->mDataLength / sizeof(int) > 1) {
                    out.StartArray();
                    for (unsigned int i = 0; i < prop->mDataLength / sizeof(int); ++i) {
                        out.Element(reinterpret_cast<int*>(prop->mData)[i]);
                    }
                    out.EndArray();
                } else {
                    out.SimpleValue(*reinterpret_cast<int*>(prop->mData));
                }
                break;

            case aiPTI_String:
                {
                    aiString s;
                    aiGetMaterialString(&ai, prop->mKey.data, prop->mSemantic, prop->mIndex, &s);
                    out.SimpleValue(s);
                }
                break;
            case aiPTI_Buffer:
                {
                    // binary data is written as series of hex-encoded octets
                    out.SimpleValue(prop->mData, prop->mDataLength);
                }
                break;
            default:
                assert(false);
        }

        out.EndObj();
    }

    out.EndArray();
    out.EndObj();
}